

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O2

void __thiscall FGameConfigFile::ReadCVars(FGameConfigFile *this,DWORD flags)

{
  bool bVar1;
  FStringCVar *this_00;
  char *key;
  char *value;
  
  while( true ) {
    bVar1 = FConfigFile::NextInSection(&this->super_FConfigFile,&key,&value);
    if (!bVar1) break;
    this_00 = (FStringCVar *)FindCVar(key,(FBaseCVar **)0x0);
    if (this_00 == (FStringCVar *)0x0) {
      this_00 = (FStringCVar *)operator_new(0x38);
      FStringCVar::FStringCVar
                (this_00,key,(char *)0x0,flags | 0x121,(_func_void_FStringCVar_ptr *)0x0);
    }
    FBaseCVar::SetGenericRep(&this_00->super_FBaseCVar,(UCVarValue)value,CVAR_String);
  }
  return;
}

Assistant:

void FGameConfigFile::ReadCVars (DWORD flags)
{
	const char *key, *value;
	FBaseCVar *cvar;
	UCVarValue val;

	flags |= CVAR_ARCHIVE|CVAR_UNSETTABLE|CVAR_AUTO;
	while (NextInSection (key, value))
	{
		cvar = FindCVar (key, NULL);
		if (cvar == NULL)
		{
			cvar = new FStringCVar (key, NULL, flags);
		}
		val.String = const_cast<char *>(value);
		cvar->SetGenericRep (val, CVAR_String);
	}
}